

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

void Iso_ManStop(Iso_Man_t *p,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  int level;
  Iso_Man_t *pIVar3;
  double dVar4;
  double dVar5;
  
  if (fVerbose != 0) {
    p->timeOther = p->timeTotal - (p->timeHash + p->timeFout);
    pIVar3 = p;
    Abc_Print((int)p,"%s =","Building ");
    level = (int)pIVar3;
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeFout * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeFout / 1000000.0,dVar4);
    Abc_Print(level,"%s =","Hashing  ");
    dVar5 = (double)(p->timeHash - p->timeSort);
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = (dVar5 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar5 / 1000000.0,dVar4);
    Abc_Print(level,"%s =","Sorting  ");
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeSort * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSort / 1000000.0,dVar4);
    Abc_Print(level,"%s =","Other    ");
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar4);
    Abc_Print(level,"%s =","TOTAL    ");
    dVar4 = (double)p->timeTotal;
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = (dVar4 * 100.0) / dVar4;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar4 / 1000000.0,dVar5);
  }
  pVVar1 = p->vTemp1;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vTemp2;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vClasses;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vSingles;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  if (p->pObjs != (Iso_Obj_t *)0x0) {
    free(p->pObjs);
  }
  free(p);
  return;
}

Assistant:

void Iso_ManStop( Iso_Man_t * p, int fVerbose )
{
    if ( fVerbose )
    {
        p->timeOther = p->timeTotal - p->timeHash - p->timeFout;
        ABC_PRTP( "Building ", p->timeFout,               p->timeTotal );
        ABC_PRTP( "Hashing  ", p->timeHash-p->timeSort,   p->timeTotal );
        ABC_PRTP( "Sorting  ", p->timeSort,               p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther,              p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal,              p->timeTotal );
    }
    Vec_PtrFree( p->vTemp1 );
    Vec_PtrFree( p->vTemp2 );
    Vec_PtrFree( p->vClasses );
    Vec_PtrFree( p->vSingles );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}